

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O0

void fsnav_ins_read_raw_input_temp(void)

{
  char *pcVar1;
  double T_scale;
  double f_scale;
  double w_scale;
  char *pcStack_30;
  char delim [3];
  char *tkn_ptr;
  char *cfg_ptr;
  int n0;
  char cStack_14;
  char input_file_token [11];
  size_t i;
  
  cfg_ptr._5_1_ = 's';
  cfg_ptr._6_1_ = 'e';
  cfg_ptr._7_1_ = 'n';
  n0._0_1_ = 's';
  n0._1_1_ = 'o';
  n0._2_1_ = 'r';
  n0._3_1_ = 's';
  cStack_14 = '_';
  input_file_token[0] = 'i';
  input_file_token[1] = 'n';
  input_file_token[2] = '\0';
  cfg_ptr._0_4_ = 7;
  w_scale._5_2_ = 0x3b2c;
  w_scale._7_1_ = 0;
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      pcVar1 = fsnav_locate_token((char *)((long)&cfg_ptr + 5),fsnav->cfg_settings,
                                  fsnav->settings_length,'=');
      if (pcVar1 != (char *)0x0) {
        __isoc99_sscanf(pcVar1,"%s",fsnav_ins_read_raw_input_temp::buffer);
      }
      fsnav_ins_read_raw_input_temp::fp = (FILE *)fopen(fsnav_ins_read_raw_input_temp::buffer,"r");
      if ((FILE *)fsnav_ins_read_raw_input_temp::fp == (FILE *)0x0) {
        printf("error: couldn\'t open input file \'%s\'.\n",fsnav_ins_read_raw_input_temp::buffer);
        fsnav->mode = -1;
      }
      else {
        fgets(fsnav_ins_read_raw_input_temp::buffer,0x1000,(FILE *)fsnav_ins_read_raw_input_temp::fp
             );
        fsnav_ins_read_raw_input_temp::buffer[0xfff] = '\0';
      }
    }
    else if (fsnav->mode < 0) {
      if (fsnav_ins_read_raw_input_temp::fp != (FILE *)0x0) {
        fclose((FILE *)fsnav_ins_read_raw_input_temp::fp);
      }
    }
    else {
      fsnav->imu->w_valid = '\0';
      fsnav->imu->f_valid = '\0';
      pcVar1 = fgets(fsnav_ins_read_raw_input_temp::buffer,0x1000,
                     (FILE *)fsnav_ins_read_raw_input_temp::fp);
      if (pcVar1 == (char *)0x0) {
        fsnav->mode = -1;
      }
      else {
        pcStack_30 = strtok(fsnav_ins_read_raw_input_temp::buffer,(char *)((long)&w_scale + 5));
        pcStack_30 = strtok((char *)0x0,(char *)((long)&w_scale + 5));
        fsnav_ins_read_raw_input_temp::w_raw[0] = atoi(pcStack_30);
        pcStack_30 = strtok((char *)0x0,(char *)((long)&w_scale + 5));
        fsnav_ins_read_raw_input_temp::w_raw[1] = atoi(pcStack_30);
        pcStack_30 = strtok((char *)0x0,(char *)((long)&w_scale + 5));
        fsnav_ins_read_raw_input_temp::w_raw[2] = atoi(pcStack_30);
        pcStack_30 = strtok((char *)0x0,(char *)((long)&w_scale + 5));
        fsnav_ins_read_raw_input_temp::f_raw[0] = atoi(pcStack_30);
        pcStack_30 = strtok((char *)0x0,(char *)((long)&w_scale + 5));
        fsnav_ins_read_raw_input_temp::f_raw[1] = atoi(pcStack_30);
        pcStack_30 = strtok((char *)0x0,(char *)((long)&w_scale + 5));
        fsnav_ins_read_raw_input_temp::f_raw[2] = atoi(pcStack_30);
        pcStack_30 = strtok((char *)0x0,(char *)((long)&w_scale + 5));
        fsnav_ins_read_raw_input_temp::T = atoi(pcStack_30);
        input_file_token[3] = '\0';
        input_file_token[4] = '\0';
        input_file_token[5] = '\0';
        input_file_token[6] = '\0';
        input_file_token[7] = '\0';
        input_file_token[8] = '\0';
        input_file_token[9] = '\0';
        input_file_token[10] = '\0';
        for (; (ulong)input_file_token._3_8_ < 3;
            input_file_token._3_8_ = input_file_token._3_8_ + 1) {
          fsnav_ins_read_raw_input_temp::w_raw[input_file_token._3_8_] =
               (int)(short)fsnav_ins_read_raw_input_temp::w_raw[input_file_token._3_8_];
          fsnav_ins_read_raw_input_temp::f_raw[input_file_token._3_8_] =
               (int)(short)fsnav_ins_read_raw_input_temp::f_raw[input_file_token._3_8_];
        }
        input_file_token[3] = '\0';
        input_file_token[4] = '\0';
        input_file_token[5] = '\0';
        input_file_token[6] = '\0';
        input_file_token[7] = '\0';
        input_file_token[8] = '\0';
        input_file_token[9] = '\0';
        input_file_token[10] = '\0';
        for (; (ulong)input_file_token._3_8_ < 3;
            input_file_token._3_8_ = input_file_token._3_8_ + 1) {
          fsnav->imu->w[input_file_token._3_8_] =
               ((double)fsnav_ins_read_raw_input_temp::w_raw[input_file_token._3_8_] * 0.00625) /
               (fsnav->imu_const).rad2deg;
          fsnav->imu->f[input_file_token._3_8_] =
               (double)fsnav_ins_read_raw_input_temp::f_raw[input_file_token._3_8_] * 0.002447;
          fsnav->imu->Tw[input_file_token._3_8_] = (double)fsnav_ins_read_raw_input_temp::T * 0.1;
          fsnav->imu->Tf[input_file_token._3_8_] = (double)fsnav_ins_read_raw_input_temp::T * 0.1;
        }
        fsnav->imu->w_valid = '\x01';
        fsnav->imu->f_valid = '\x01';
        fsnav->imu->Tw_valid = '\x01';
        fsnav->imu->Tf_valid = '\x01';
      }
    }
  }
  return;
}

Assistant:

void fsnav_ins_read_raw_input_temp(void)
{
	size_t i;

	const char input_file_token[] = "sensors_in"; // имя параметра конфигурации с входным файлом
	const int  n0 = 7;                            // требуемое количество параметров в строке входного файла
														  
	static FILE *fp = NULL;                       // указатель на файл
	static char  buffer[FSNAV_INS_BUFFER_SIZE];    // строковый буфер

	char       *cfg_ptr;        // указатель на параметр в строке конфигурации
	char       *tkn_ptr;        // указатель на токен в стоке файла
	const char  delim[] = ",;"; // разделители

	// масштабные коэффициенты
#ifdef BIT16
	const double w_scale = 0.00625;
	const double f_scale = 0.002447;
#else
	const double w_scale = 0.00625/pow(2,16);
	const double f_scale = 0.002447/pow(2,16);
#endif
	const double T_scale = 0.1;

	// измерения
	static int w_raw[3];
	static int f_raw[3];
	static int T;

	// проверка инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация
	if (fsnav->mode == 0) {
		// поиск имени входного файла в конфигурации
		cfg_ptr = fsnav_locate_token(input_file_token, fsnav->cfg_settings, fsnav->settings_length, '=');
		if (cfg_ptr != NULL)
			sscanf(cfg_ptr, "%s", buffer);
		// открытие файла
		fp = fopen(buffer, "r");
		if (fp == NULL) {
			printf("error: couldn't open input file '%s'.\n", buffer);
			fsnav->mode = -1;
			return;
		}
		// считывание заголовка
		fgets(buffer, FSNAV_INS_BUFFER_SIZE, fp);
		// обеспечить завершение строки нулевым символом
		buffer[FSNAV_INS_BUFFER_SIZE-1] = '\0';
	}

	// завершение работы
	else if (fsnav->mode < 0) {
		if (fp != NULL)
			fclose(fp); // закрытие файла, если он был открыт
		return;
	}

	// основной цикл
	else {
		// сброс флагов достоверности показаний датчиков
		fsnav->imu->w_valid = 0;
		fsnav->imu->f_valid = 0;
		// чтение строки из файла
		if (fgets(buffer, FSNAV_INS_BUFFER_SIZE, fp) == NULL) {
			fsnav->mode = -1; // завершение работы, если не удалось прочитать строку
			return;
		}

		// парсинг строки
		// DIAG_STAT
		tkn_ptr = strtok(buffer, delim);
		// X_GYRO
		tkn_ptr = strtok(NULL, delim);
		w_raw[0] = atoi(tkn_ptr);
		// Y_GYRO
		tkn_ptr = strtok(NULL, delim);
		w_raw[1] = atoi(tkn_ptr);
		// Z_GYRO
		tkn_ptr = strtok(NULL, delim);
		w_raw[2] = atoi(tkn_ptr);
		// X_ACCL
		tkn_ptr = strtok(NULL, delim);
		f_raw[0] = atoi(tkn_ptr);
		// Y_ACCL
		tkn_ptr = strtok(NULL, delim);
		f_raw[1] = atoi(tkn_ptr);
		// Z_ACCL
		tkn_ptr = strtok(NULL, delim);
		f_raw[2] = atoi(tkn_ptr);
		// TEMP_OUT
		tkn_ptr = strtok(NULL, delim);
		T = (int)atoi(tkn_ptr);

#ifdef BIT16
		for (i = 0; i < 3; i++) {
			w_raw[i] = (int16_t)w_raw[i];
			f_raw[i] = (int16_t)f_raw[i];
		}
#else
		for (i = 0; i < 3; i++) {
			w_raw[i] = (int32_t)w_raw[i];
			f_raw[i] = (int32_t)f_raw[i];
		}
#endif

		// умножение на масштабный коэффициент + перевод в радианы
		for (i = 0; i < 3; i++) {
			fsnav->imu->w [i] = w_raw[i] * w_scale / fsnav->imu_const.rad2deg;
			fsnav->imu->f [i] = f_raw[i] * f_scale;
			fsnav->imu->Tw[i] = T * T_scale;
			fsnav->imu->Tf[i] = T * T_scale;
		}

		// установка флагов достоверности
		fsnav->imu->w_valid  = 1;
		fsnav->imu->f_valid  = 1;
		fsnav->imu->Tw_valid = 1;
		fsnav->imu->Tf_valid = 1;
	}
}